

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O0

Read<int> * __thiscall Omega_h::Read<int>::name_abi_cxx11_(Read<int> *this)

{
  string *psVar1;
  Write<int> *in_RSI;
  Read<signed_char> *this_local;
  
  psVar1 = Write<int>::name_abi_cxx11_(in_RSI);
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return this;
}

Assistant:

std::string name() const { return write_.name(); }